

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O2

size_t __thiscall
Problem_CGBG_FF::ComputeNumberOfAgentsPresentAtHouse
          (Problem_CGBG_FF *this,Index houseI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *a_vec)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  const_reference this_00;
  const_reference pvVar4;
  const_reference this_01;
  size_t sVar5;
  ulong __n;
  
  this_00 = std::vector<Scope,_std::allocator<Scope>_>::at
                      (&this->_m_agentsForHouse_action,(ulong)houseI);
  sVar5 = 0;
  for (uVar3 = 0; __n = (ulong)uVar3,
      __n < (ulong)((long)(this_00->super_SDT).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(this_00->super_SDT).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2); uVar3 = uVar3 + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this_00->super_SDT,__n);
    uVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(a_vec,__n);
    uVar2 = *pvVar4;
    this_01 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::at(&this->_m_houseIndices_action,(ulong)uVar1);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_01,(ulong)uVar2);
    sVar5 = sVar5 + (*pvVar4 == houseI);
  }
  return sVar5;
}

Assistant:

size_t Problem_CGBG_FF::ComputeNumberOfAgentsPresentAtHouse(Index houseI, const vector<Index>& a_vec) const
{    
    size_t nrAgentsPresent = 0;
    const vector<Index> & tupleOfAgents = _m_agentsForHouse_action.at(houseI);
    for(Index i=0; i < tupleOfAgents.size(); i++)
    {
        Index agI = tupleOfAgents.at(i); //<-agent index
        Index acI = a_vec.at(i);      //<-its action

        const vector<Index>& hs = _m_houseIndices_action.at(agI);
        //cout << "agI="<<agI<<" hs=" << PrintTools::SoftPrintVector(hs)<<endl;
        Index h = hs.at(acI);

        if(h==houseI)
            nrAgentsPresent++;
    }
    //cout << "nrAgentsPresent="<<nrAgentsPresent<<endl;
    return nrAgentsPresent;

}